

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::anon_unknown_0::ImageLoadStoreUniformLimitsTest::doesProgramLink
          (ImageLoadStoreUniformLimitsTest *this,char *fragment_shader_code,
          char *geometry_shader_code,char *tesselation_control_shader_code,
          char *tesselation_evaluation_shader_code,char *vertex_shader_code)

{
  GLuint program;
  bool is_program_built;
  bool local_9;
  
  local_9 = true;
  program = ShaderImageLoadStoreBase::BuildProgram
                      (&this->super_ShaderImageLoadStoreBase,vertex_shader_code,
                       tesselation_control_shader_code,tesselation_evaluation_shader_code,
                       geometry_shader_code,fragment_shader_code,&local_9);
  if (program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,program);
  }
  return local_9;
}

Assistant:

bool doesProgramLink(const char* fragment_shader_code, const char* geometry_shader_code,
						 const char* tesselation_control_shader_code, const char* tesselation_evaluation_shader_code,
						 const char* vertex_shader_code)
	{
		bool   is_program_built = true;
		GLuint program_id		= 0;

		program_id =
			BuildProgram(vertex_shader_code, tesselation_control_shader_code, tesselation_evaluation_shader_code,
						 geometry_shader_code, fragment_shader_code, &is_program_built);

		if (0 != program_id)
		{
			glDeleteProgram(program_id);
		}

		return is_program_built;
	}